

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cpp
# Opt level: O2

string * miniros::names::append(string *__return_storage_ptr__,string *left,string *right)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,left,"/");
  std::operator+(&bStack_58,&local_38,right);
  clean(__return_storage_ptr__,&bStack_58);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string append(const std::string& left, const std::string& right)
{
  return clean(left + "/" + right);
}